

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comb_filter.hpp
# Opt level: O2

void re::math::comb_filter<float,512l,512l>(span<const_float,_512L> in,span<float,_512L> out)

{
  pointer extraout_RDX;
  pointer peVar1;
  pointer extraout_RDX_00;
  long lVar2;
  float fVar3;
  span<const_float,__1L> input;
  span<float,_512L> out_local;
  int local_3c;
  span_iterator<gsl::span<float,_512L>,_false> local_38;
  span_iterator<gsl::span<float,_512L>,_false> local_28;
  
  local_28.span_ = &out_local;
  local_38.span_ = &out_local;
  local_28.index_ = 0;
  local_38.index_ = 0x200;
  local_3c = 0;
  out_local = out;
  ::std::fill<gsl::details::span_iterator<gsl::span<float,512l>,false>,int>
            (&local_28,&local_38,&local_3c);
  peVar1 = extraout_RDX;
  for (lVar2 = 4; lVar2 != 0x800; lVar2 = lVar2 + 4) {
    input.storage_.data_ = peVar1;
    input.storage_.super_extent_type<_1L>.size_ = (long)in.storage_.data_ + lVar2;
    fVar3 = mean<float,_1l>((math *)0x1,input);
    *(float *)((long)out_local.storage_.data_ + lVar2) =
         fVar3 + *(float *)((long)out_local.storage_.data_ + lVar2);
    peVar1 = extraout_RDX_00;
  }
  return;
}

Assistant:

void
comb_filter(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    static_assert(N_in >= 0 && N_out >= 0);
    static_assert(N_in % N_out == 0);

    constexpr auto n_new =  (N_in > N_out) ? N_in - N_out : 0;
    constexpr auto stage = N_in / N_out;

    if (stage > 1) {
        comb_filter(gsl::span<T const, n_new>(in.data(), n_new), out);
    } else {
        std::fill(std::begin(out), std::end(out), 0);
    }

    for (auto i = 1; i < N_out; ++i) {
        out[i] += mean(in.subspan(stage * (i - 1) + 1, 2*stage - 1));
    }
}